

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

int __thiscall
CVmObjLookupTable::getp_set_def_val
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  int iVar3;
  vm_val_t *pvVar4;
  
  if (getp_set_def_val(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_set_def_val();
  }
  pvVar4 = retval;
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_set_def_val::desc);
  if (iVar3 == 0) {
    add_undo_rec((CVmObjLookupTable *)pvVar4,self,LOOKUPTAB_UNDO_DEFVAL,(vm_val_t *)0x0,
                 (vm_val_t *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 0x10));
    pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
    pvVar4 = sp_ + -1;
    aVar2 = sp_[-1].val;
    sp_ = sp_ + -1;
    *(undefined8 *)(pcVar1 + 0x10) = *(undefined8 *)pvVar4;
    *(anon_union_8_8_cb74652f_for_val *)(pcVar1 + 0x18) = aVar2;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_set_def_val(VMG_ vm_obj_id_t self,
                                        vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save undo */
    add_undo_rec(vmg_ self, LOOKUPTAB_UNDO_DEFVAL,
                 0, &get_ext()->default_value);

    /* set the default value to the argument value */
    G_stk->pop(&get_ext()->default_value);

    /* return self */
    retval->set_obj(self);
    return TRUE;
}